

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O1

bool QPDF::validatePDFVersion(char **p,string *version)

{
  char cVar1;
  char *pcVar2;
  bool bVar3;
  
  bVar3 = (byte)(**p - 0x30U) < 10;
  if (bVar3) {
    pcVar2 = *p;
    cVar1 = *pcVar2;
    while ((byte)(cVar1 - 0x30U) < 10) {
      *p = pcVar2 + 1;
      std::__cxx11::string::_M_replace_aux((ulong)version,version->_M_string_length,0,'\x01');
      pcVar2 = *p;
      cVar1 = *pcVar2;
    }
    if ((cVar1 == '.') && ((byte)(pcVar2[1] - 0x30U) < 10)) {
      *p = pcVar2 + 1;
      std::__cxx11::string::_M_replace_aux((ulong)version,version->_M_string_length,0,'\x01');
      pcVar2 = *p;
      cVar1 = *pcVar2;
      while ((byte)(cVar1 - 0x30U) < 10) {
        *p = pcVar2 + 1;
        std::__cxx11::string::_M_replace_aux((ulong)version,version->_M_string_length,0,'\x01');
        pcVar2 = *p;
        cVar1 = *pcVar2;
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool
QPDF::validatePDFVersion(char const*& p, std::string& version)
{
    bool valid = util::is_digit(*p);
    if (valid) {
        while (util::is_digit(*p)) {
            version.append(1, *p++);
        }
        if ((*p == '.') && util::is_digit(*(p + 1))) {
            version.append(1, *p++);
            while (util::is_digit(*p)) {
                version.append(1, *p++);
            }
        } else {
            valid = false;
        }
    }
    return valid;
}